

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int GetMsgSeanet(SEANET *pSeanet,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  int iVar1;
  double dVar2;
  undefined1 local_8b0 [8];
  CHRONO chrono;
  uchar *puStack_860;
  int remainingdatalen;
  uchar *remainingdata;
  uchar *puStack_850;
  int len;
  uchar *ptr;
  int local_840;
  int recvbuflen;
  int BytesReceived;
  int i;
  uchar recvbuf [2048];
  int *pNbdatabytes_local;
  int databuflen_local;
  uchar *databuf_local;
  int mid_local;
  SEANET *pSeanet_local;
  
  recvbuflen = 0;
  local_840 = 0;
  ptr._4_4_ = 0;
  puStack_850 = (uchar *)0x0;
  remainingdata._4_4_ = 0;
  puStack_860 = (uchar *)0x0;
  chrono._68_4_ = 0;
  recvbuf._2040_8_ = pNbdatabytes;
  StartChrono((CHRONO *)local_8b0);
  memset(&BytesReceived,0,0x800);
  ptr._4_4_ = 0x7ff;
  local_840 = 0;
  iVar1 = ReadAllRS232Port(&pSeanet->RS232Port,(uint8 *)&BytesReceived,0xb);
  if (iVar1 == 0) {
    local_840 = local_840 + 0xb;
    recvbuflen = 0;
    while (iVar1 = AnalyseBufHdrHexBinLenMIDSeanet
                             ((uchar *)((long)&BytesReceived + (long)recvbuflen),
                              local_840 - recvbuflen,mid,(int *)((long)&remainingdata + 4)),
          iVar1 != 0) {
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_8b0);
      if (4.0 < dVar2) {
        printf("Error reading data from a Seanet : Message timeout. \n");
        return 2;
      }
      if (ptr._4_4_ < local_840 + 1) {
        printf("Error reading data from a Seanet : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&pSeanet->RS232Port,(uint8 *)((long)&BytesReceived + (long)local_840)
                               ,1);
      if (iVar1 != 0) {
        printf("Error reading data from a Seanet. \n");
        return 1;
      }
      local_840 = local_840 + 1;
      recvbuflen = recvbuflen + 1;
    }
    if (ptr._4_4_ < remainingdata._4_4_ + recvbuflen) {
      printf("Error reading data from a Seanet : Invalid data. \n");
      pSeanet_local._4_4_ = 4;
    }
    else {
      if (0 < remainingdata._4_4_ - (local_840 - recvbuflen)) {
        iVar1 = ReadAllRS232Port(&pSeanet->RS232Port,
                                 (uint8 *)((long)&BytesReceived + (long)local_840),
                                 remainingdata._4_4_ - (local_840 - recvbuflen));
        if (iVar1 != 0) {
          printf("Error reading data from a Seanet. \n");
          return 1;
        }
        local_840 = remainingdata._4_4_ + recvbuflen;
      }
      iVar1 = FindLatestMsgWithMIDSeanet
                        ((uchar *)&BytesReceived,local_840,mid,&stack0xfffffffffffff7b0,
                         (int *)((long)&remainingdata + 4),&stack0xfffffffffffff7a0,
                         (int *)&chrono.field_0x44);
      if (iVar1 == 0) {
        if (0 < (int)chrono._68_4_) {
          printf("Error getting data from a Seanet : Unexpected data after a message. \n");
        }
        memset(databuf,0,(long)databuflen);
        *(int *)recvbuf._2040_8_ = remainingdata._4_4_;
        if (databuflen < *(int *)recvbuf._2040_8_) {
          printf("Error getting data from a Seanet : Too small data buffer. \n");
          pSeanet_local._4_4_ = 1;
        }
        else {
          if (0 < *(int *)recvbuf._2040_8_) {
            memcpy(databuf,puStack_850,(long)*(int *)recvbuf._2040_8_);
          }
          pSeanet_local._4_4_ = 0;
        }
      }
      else {
        printf("Error reading data from a Seanet : Invalid data. \n");
        pSeanet_local._4_4_ = 4;
      }
    }
  }
  else {
    printf("Error reading data from a Seanet. \n");
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int GetMsgSeanet(SEANET* pSeanet, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[MAX_NB_BYTES_SEANET];
	int i = 0;
	int BytesReceived = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	unsigned char* remainingdata = NULL;
	int remainingdatalen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SEANET-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf, MIN_MESSAGE_LEN_SEANET) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += MIN_MESSAGE_LEN_SEANET;

	i = 0;
	while (AnalyseBufHdrHexBinLenMIDSeanet(recvbuf+i, BytesReceived-i, mid, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SEANET)
		{
			printf("Error reading data from a Seanet : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		if (BytesReceived+1 > recvbuflen)
		{
			printf("Error reading data from a Seanet : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, 1) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += 1;
		i++;
	}

	// Notes :
	// BytesReceived+len-(BytesReceived-i) = len+i
	// BytesReceived = MIN_MESSAGE_LEN_SEANET+i
	// len-MIN_MESSAGE_LEN_SEANET = len-(BytesReceived-i)
	if (len+i > recvbuflen)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	// Read the remaining bytes of the message according to the length found.
	if (len-(BytesReceived-i) > 0)
	{
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, len-(BytesReceived-i)) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += (len-(BytesReceived-i));
	}

	if (FindLatestMsgWithMIDSeanet(recvbuf, BytesReceived, mid, 
		&ptr, &len, &remainingdata, &remainingdatalen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	if (remainingdatalen > 0)
	{
		printf("Error getting data from a Seanet : Unexpected data after a message. \n");
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	*pNbdatabytes = len;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Error getting data from a Seanet : Too small data buffer. \n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}